

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::dense::operator-
          (dense *this,SquareMatrix<std::complex<float>_> *lhs,
          SquareMatrix<std::complex<float>_> *rhs)

{
  float fVar1;
  float fVar2;
  complex<float> *pcVar3;
  complex<float> *pcVar4;
  long lVar5;
  long lVar6;
  data_type extraout_RDX;
  long lVar7;
  long lVar8;
  long lVar9;
  SquareMatrix<std::complex<float>_> SVar10;
  
  if (rhs->size_ == lhs->size_) {
    if (0 < lhs->size_) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        lVar7 = lhs->size_;
        if (0 < lVar7) {
          lVar8 = 0;
          do {
            lVar9 = rhs->size_ * lVar5;
            pcVar3 = (rhs->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
            lVar7 = lVar7 * lVar5;
            pcVar4 = (lhs->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
            fVar1 = *(float *)((long)&pcVar4[lVar8]._M_value + lVar7 + 4);
            fVar2 = *(float *)((long)&pcVar3[lVar8]._M_value + lVar9 + 4);
            *(float *)((long)&pcVar4[lVar8]._M_value + lVar7) =
                 *(float *)((long)&pcVar4[lVar8]._M_value + lVar7) -
                 *(float *)((long)&pcVar3[lVar8]._M_value + lVar9);
            *(float *)((long)&pcVar4[lVar8]._M_value + lVar7 + 4) = fVar1 - fVar2;
            lVar8 = lVar8 + 1;
            lVar7 = lhs->size_;
          } while (lVar8 < lVar7);
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 8;
      } while (lVar6 < lhs->size_);
    }
    SquareMatrix<std::complex<float>_>::SquareMatrix((SquareMatrix<std::complex<float>_> *)this,lhs)
    ;
    SVar10.data_._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
         super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    SVar10.size_ = (size_type_conflict)this;
    return SVar10;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator-=(const SquareMatrix<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator-=( const SquareMatrix< T >& rhs ) {
          assert( rhs.size() == size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              (*this)(i,j) -= rhs(i,j) ;
            }
          }
          return *this ;
        }